

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddImage.c
# Opt level: O2

void Extra_bddImageCompute_rec(Extra_ImageTree_t *pTree,Extra_ImageNode_t *pNode)

{
  DdManager *manager;
  int iVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  
  manager = pNode->dd;
  if (pNode->pNode1 == (Extra_ImageNode_t *)0x0) {
    if (pNode->bCube != (DdNode *)0x0) {
      pDVar2 = pNode->bImage;
      pDVar3 = Cudd_bddExistAbstract(manager,pDVar2,pNode->bCube);
      pNode->bImage = pDVar3;
      Cudd_Ref(pDVar3);
      Cudd_RecursiveDeref(manager,pDVar2);
      return;
    }
  }
  else {
    Extra_bddImageCompute_rec(pTree,pNode->pNode1);
    if (pNode->pNode2 != (Extra_ImageNode_t *)0x0) {
      Extra_bddImageCompute_rec(pTree,pNode->pNode2);
    }
    if (pNode->bImage != (DdNode *)0x0) {
      Cudd_RecursiveDeref(manager,pNode->bImage);
    }
    pNode->bImage = (DdNode *)0x0;
    pDVar2 = pNode->pNode1->bImage;
    pDVar3 = pNode->pNode2->bImage;
    if (pNode->bCube == (DdNode *)0x0) {
      pDVar2 = Cudd_bddAnd(manager,pDVar2,pDVar3);
    }
    else {
      pDVar2 = Cudd_bddAndAbstract(manager,pDVar2,pDVar3,pNode->bCube);
    }
    pNode->bImage = pDVar2;
    Cudd_Ref(pDVar2);
    if (pTree->fVerbose != 0) {
      iVar1 = Cudd_DagSize(pNode->bImage);
      if (pTree->nNodesMax < iVar1) {
        pTree->nNodesMax = iVar1;
      }
    }
  }
  return;
}

Assistant:

void Extra_bddImageCompute_rec( Extra_ImageTree_t * pTree, Extra_ImageNode_t * pNode )
{
    DdManager * dd = pNode->dd;
    DdNode * bTemp;
    int nNodes;

    // trivial case
    if ( pNode->pNode1 == NULL )
    {
        if ( pNode->bCube )
        {
            pNode->bImage = Cudd_bddExistAbstract( dd, bTemp = pNode->bImage, pNode->bCube ); 
            Cudd_Ref( pNode->bImage );
            Cudd_RecursiveDeref( dd, bTemp );
        }
        return;
    }

    // compute the children
    if ( pNode->pNode1 )
        Extra_bddImageCompute_rec( pTree, pNode->pNode1 );
    if ( pNode->pNode2 )
        Extra_bddImageCompute_rec( pTree, pNode->pNode2 );

    // clean the old image
    if ( pNode->bImage )
        Cudd_RecursiveDeref( dd, pNode->bImage );
    pNode->bImage = NULL;

    // compute the new image
    if ( pNode->bCube )
        pNode->bImage = Cudd_bddAndAbstract( dd, 
            pNode->pNode1->bImage, pNode->pNode2->bImage, pNode->bCube );
    else
        pNode->bImage = Cudd_bddAnd( dd, pNode->pNode1->bImage, pNode->pNode2->bImage );
    Cudd_Ref( pNode->bImage );

    if ( pTree->fVerbose )
    {
        nNodes = Cudd_DagSize( pNode->bImage );
        if ( pTree->nNodesMax < nNodes )
            pTree->nNodesMax = nNodes;
    }
}